

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O0

file_storage * __thiscall
libtorrent::anon_unknown_40::make_file_storage
          (file_storage *__return_storage_ptr__,anon_unknown_40 *this,
          span<const_libtorrent::create_file_entry> files,int piece_size)

{
  int64_t file_size;
  string_view symlink_path;
  create_file_entry *path;
  int n;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  file_flags_t local_59;
  create_file_entry *local_58;
  create_file_entry *f;
  create_file_entry *__end2;
  create_file_entry *__begin2;
  span<const_libtorrent::create_file_entry> *__range2;
  undefined1 local_25;
  int local_24;
  anon_unknown_40 *paStack_20;
  int piece_size_local;
  span<const_libtorrent::create_file_entry> files_local;
  file_storage *ret;
  
  files_local.m_ptr = files.m_ptr;
  local_24 = (int)files.m_len;
  local_25 = 0;
  paStack_20 = this;
  files_local.m_len = (difference_type)__return_storage_ptr__;
  file_storage::file_storage(__return_storage_ptr__);
  file_storage::set_piece_length(__return_storage_ptr__,local_24);
  __begin2 = (create_file_entry *)&stack0xffffffffffffffe0;
  __end2 = span<const_libtorrent::create_file_entry>::begin
                     ((span<const_libtorrent::create_file_entry> *)__begin2);
  f = span<const_libtorrent::create_file_entry>::end
                ((span<const_libtorrent::create_file_entry> *)__begin2);
  for (; path = __end2, __end2 != f; __end2 = __end2 + 1) {
    local_58 = __end2;
    file_size = __end2->size;
    local_59.m_val = (__end2->flags).m_val;
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70);
    symlink_path._M_str = local_70._M_str;
    symlink_path._M_len = local_70._M_len;
    file_storage::add_file
              (__return_storage_ptr__,&path->filename,file_size,local_59,0,symlink_path,(char *)0x0)
    ;
  }
  n = libtorrent::aux::calc_num_pieces(__return_storage_ptr__);
  file_storage::set_num_pieces(__return_storage_ptr__,n);
  return __return_storage_ptr__;
}

Assistant:

file_storage make_file_storage(span<create_file_entry const> files, int const piece_size)
	{
		file_storage ret;
		ret.set_piece_length(piece_size);
		for (auto const& f : files)
			ret.add_file(f.filename, f.size, f.flags);
		ret.set_num_pieces(aux::calc_num_pieces(ret));
		return ret;
	}